

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O0

Amap_Obj_t * Amap_ManCreatePo(Amap_Man_t *p,Amap_Obj_t *pFan0)

{
  uint uVar1;
  int iVar2;
  Amap_Obj_t *Entry;
  Amap_Obj_t *pAVar3;
  Amap_Obj_t *pObj;
  Amap_Obj_t *pFan0_local;
  Amap_Man_t *p_local;
  
  Entry = Amap_ManSetupObj(p);
  uVar1 = Vec_PtrSize(p->vPos);
  *(ulong *)Entry = *(ulong *)Entry & 0xe0000000ffffffff | ((ulong)uVar1 & 0x1fffffff) << 0x20;
  Vec_PtrPush(p->vPos,Entry);
  *(ulong *)Entry = *(ulong *)Entry & 0xfffffffffffffff8 | 3;
  iVar2 = Amap_ObjToLit(pFan0);
  Entry->Fan[0] = iVar2;
  pAVar3 = Amap_Regular(pFan0);
  pAVar3->nRefs = pAVar3->nRefs + 1;
  pAVar3 = Amap_Regular(pFan0);
  Entry->Level = pAVar3->Level;
  if (p->nLevelMax < (int)Entry->Level) {
    p->nLevelMax = Entry->Level;
  }
  if (p->nLevelMax < 0xffe) {
    p->nObjs[3] = p->nObjs[3] + 1;
    return Entry;
  }
  __assert_fail("p->nLevelMax < 4094",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapGraph.c"
                ,0x79,"Amap_Obj_t *Amap_ManCreatePo(Amap_Man_t *, Amap_Obj_t *)");
}

Assistant:

Amap_Obj_t * Amap_ManCreatePo( Amap_Man_t * p, Amap_Obj_t * pFan0 )
{
    Amap_Obj_t * pObj;
    pObj = Amap_ManSetupObj( p );
    pObj->IdPio  = Vec_PtrSize( p->vPos );
    Vec_PtrPush( p->vPos, pObj );
    pObj->Type   = AMAP_OBJ_PO;
    pObj->Fan[0] = Amap_ObjToLit(pFan0);  Amap_Regular(pFan0)->nRefs++;
    pObj->Level  = Amap_Regular(pFan0)->Level;
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    assert( p->nLevelMax < 4094 ); // 2^12-2
    p->nObjs[AMAP_OBJ_PO]++;
    return pObj;
}